

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::KotlinKMPGenerator
          (KotlinKMPGenerator *this,Parser *parser,string *path,string *file_name)

{
  IdlNamer *this_00;
  KotlinKMPGenerator *pKVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_750;
  allocator<char> local_74f;
  allocator<char> local_74e;
  allocator<char> local_74d;
  allocator<char> local_74c;
  allocator<char> local_74b;
  allocator<char> local_74a;
  allocator<char> local_749;
  allocator_type local_748;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_747;
  allocator<char> local_746;
  allocator<char> local_745;
  allocator<char> local_744;
  allocator<char> local_743;
  allocator<char> local_742;
  allocator<char> local_741;
  allocator<char> local_740;
  allocator<char> local_73f;
  allocator<char> local_73e;
  allocator<char> local_73d;
  allocator<char> local_73c;
  allocator<char> local_73b;
  allocator<char> local_73a;
  allocator<char> local_739;
  allocator<char> local_738;
  allocator<char> local_737;
  allocator<char> local_736;
  allocator<char> local_735;
  allocator<char> local_734;
  allocator<char> local_733;
  allocator<char> local_732;
  allocator<char> local_731;
  KotlinKMPGenerator *local_730;
  string local_728;
  string local_708;
  string local_6e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6c8;
  undefined1 local_698 [64];
  undefined8 local_658;
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  undefined8 local_5b0;
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  Config local_180;
  
  local_730 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,"",(allocator<char> *)&local_540);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,".",(allocator<char> *)local_698);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"kt",&local_750);
  pKVar1 = local_730;
  BaseGenerator::BaseGenerator
            (&local_730->super_BaseGenerator,parser,path,file_name,&local_708,&local_728,&local_6e8)
  ;
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_708);
  (pKVar1->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_002fa3e0;
  local_698._0_4_ = kKeep;
  local_698._4_4_ = kUpperCamel;
  local_698._8_4_ = kLowerCamel;
  local_698._12_4_ = kKeep;
  local_698._16_4_ = kLowerCamel;
  local_698._20_4_ = kLowerCamel;
  local_698._24_4_ = kUpperCamel;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_698 + 0x20),"",(allocator<char> *)&local_540);
  local_658._0_4_ = AfterConvertingCase;
  local_658._4_4_ = kLowerCamel;
  std::__cxx11::string::string<std::allocator<char>>(local_650,".",&local_750);
  std::__cxx11::string::string<std::allocator<char>>(local_630,"",&local_749);
  std::__cxx11::string::string<std::allocator<char>>(local_610,"T",&local_74a);
  std::__cxx11::string::string<std::allocator<char>>(local_5f0,"",&local_74b);
  std::__cxx11::string::string<std::allocator<char>>(local_5d0,"E",&local_74c);
  local_5b0._0_4_ = kUpperCamel;
  local_5b0._4_4_ = kLowerCamel;
  std::__cxx11::string::string<std::allocator<char>>(local_5a8,"",&local_74d);
  std::__cxx11::string::string<std::allocator<char>>(local_588,"",&local_74e);
  std::__cxx11::string::string<std::allocator<char>>(local_568,".kt",&local_74f);
  WithFlagOptions(&local_180,(Config *)local_698,&parser->opts,path);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"package",&local_750);
  std::__cxx11::string::string<std::allocator<char>>(local_520,"as",&local_749);
  std::__cxx11::string::string<std::allocator<char>>(local_500,"typealias",&local_74a);
  std::__cxx11::string::string<std::allocator<char>>(local_4e0,"class",&local_74b);
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"this",&local_74c);
  std::__cxx11::string::string<std::allocator<char>>(local_4a0,"super",&local_74d);
  std::__cxx11::string::string<std::allocator<char>>(local_480,"val",&local_74e);
  std::__cxx11::string::string<std::allocator<char>>(local_460,"var",&local_74f);
  std::__cxx11::string::string<std::allocator<char>>(local_440,"fun",&local_731);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"for",&local_732);
  std::__cxx11::string::string<std::allocator<char>>(local_400,"null",&local_733);
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"true",&local_734);
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"false",&local_735);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"is",&local_736);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"in",&local_737);
  std::__cxx11::string::string<std::allocator<char>>(local_360,"throw",&local_738);
  std::__cxx11::string::string<std::allocator<char>>(local_340,"return",&local_739);
  std::__cxx11::string::string<std::allocator<char>>(local_320,"break",&local_73a);
  std::__cxx11::string::string<std::allocator<char>>(local_300,"continue",&local_73b);
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"object",&local_73c);
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"if",&local_73d);
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"try",&local_73e);
  std::__cxx11::string::string<std::allocator<char>>(local_280,"else",&local_73f);
  std::__cxx11::string::string<std::allocator<char>>(local_260,"while",&local_740);
  std::__cxx11::string::string<std::allocator<char>>(local_240,"do",&local_741);
  std::__cxx11::string::string<std::allocator<char>>(local_220,"when",&local_742);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"interface",&local_743);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"typeof",&local_744);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"Any",&local_745);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"Character",&local_746);
  __l._M_len = 0x1e;
  __l._M_array = &local_540;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_6c8,__l,&local_747,&local_748);
  this_00 = &local_730->namer_;
  lVar2 = 0x3a0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_540._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  IdlNamer::IdlNamer(this_00,&local_180,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_6c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_6c8);
  Namer::Config::~Config(&local_180);
  Namer::Config::~Config((Config *)local_698);
  return;
}

Assistant:

KotlinKMPGenerator(const Parser &parser, const std::string &path,
                     const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "", ".", "kt"),
        namer_(WithFlagOptions(KotlinDefaultConfig(), parser.opts, path),
               KotlinKeywords()) {}